

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

void av1_scale_references(AV1_COMP *cpi,InterpFilter filter,int phase,int use_optimized_scaler)

{
  YV12_BUFFER_CONFIG *ybf;
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BufferPool *pBVar6;
  AV1_PRIMARY *pAVar7;
  pthread_mutex_t *__mutex;
  int *piVar8;
  SequenceHeader *pSVar9;
  _Bool _Var10;
  int num_planes;
  int iVar11;
  long lVar12;
  RefCntBuffer *pRVar13;
  ulong uVar14;
  ulong uVar15;
  MV_REF *pMVar16;
  uint8_t *puVar17;
  TPL_MV_REF *pTVar18;
  RefCntBuffer *pRVar19;
  RefCntBuffer *pRVar20;
  int *piVar21;
  long lVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  num_planes = (uint)(uVar1 == '\0') * 2 + 1;
  lVar22 = 1;
  do {
    if ((cpi->ref_frame_flags & (uint)""[lVar22]) == 0) {
      if (((cpi->oxcf).pass != AOM_RC_ONE_PASS) || (cpi->ppi->lap_enabled != 0)) goto LAB_001ba7a6;
    }
    else {
      uVar23 = (uint)lVar22;
      lVar12 = (long)(cpi->common).remapped_ref_idx[uVar23 - 1];
      if (lVar12 == -1) {
        pRVar13 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar13 = (cpi->common).ref_frame_map[lVar12];
      }
      if (pRVar13 == (RefCntBuffer *)0x0) {
LAB_001ba7a6:
        cpi->scaled_ref_buf[lVar22 + -1] = (RefCntBuffer *)0x0;
      }
      else {
        pBVar6 = (cpi->common).buffer_pool;
        pAVar7 = cpi->ppi;
        if (((pAVar7->use_svc != 0) && ((cpi->svc).force_zero_mode_spatial_ref != 0)) &&
           ((pAVar7->rtc_ref).set_ref_frame_config != 0)) {
          if ((char)lVar22 == '\a') {
LAB_001ba730:
            if ((cpi->svc).skip_mvsearch_altref != 0) goto LAB_001bacf3;
          }
          else if ((uVar23 & 0xff) == 4) {
LAB_001ba71c:
            if ((cpi->svc).skip_mvsearch_gf != 0) goto LAB_001bacf3;
            if (lVar22 == 7) goto LAB_001ba730;
          }
          else if ((uVar23 & 0xff) == 1) {
            if ((cpi->svc).skip_mvsearch_last != 0) goto LAB_001bacf3;
            if ((char)lVar22 == '\a') goto LAB_001ba730;
            if ((uVar23 & 0xff) == 4) goto LAB_001ba71c;
          }
        }
        if (((((cpi->oxcf).pass != AOM_RC_ONE_PASS) || (pAVar7->lap_enabled != 0)) ||
            (((cpi->oxcf).mode != '\x01' ||
             (((cpi->oxcf).gf_cfg.lag_in_frames != 0 || (lVar22 != 4)))))) ||
           (((cpi->oxcf).superres_cfg.enable_superres == false ||
            ((int)((cpi->common).current_frame.frame_number - 1) <=
             (cpi->rc).frame_num_last_gf_refresh)))) {
          iVar11 = (pRVar13->buf).field_2.field_0.y_crop_width;
          iVar3 = (cpi->common).width;
          if ((iVar11 == iVar3) &&
             ((pRVar13->buf).field_3.field_0.y_crop_height == (cpi->common).height)) {
            lVar12 = (long)(cpi->common).remapped_ref_idx[uVar23 - 1];
            if (lVar12 == -1) {
              pRVar19 = (RefCntBuffer *)0x0;
            }
            else {
              pRVar19 = (cpi->common).ref_frame_map[lVar12];
            }
            (pRVar19->buf).field_2.field_0.y_crop_width = iVar11;
            (pRVar19->buf).field_3.field_0.y_crop_height =
                 (pRVar13->buf).field_3.field_0.y_crop_height;
            cpi->scaled_ref_buf[lVar22 + -1] = pRVar19;
            pRVar19->ref_count = pRVar19->ref_count + 1;
          }
          else {
            if (((iVar3 < iVar11) ||
                ((cpi->common).height < (pRVar13->buf).field_3.field_0.y_crop_height)) &&
               (((pRVar13->buf).border < 0x120 &&
                (iVar11 = aom_yv12_realloc_with_new_border_c
                                    (&(cpi->common).ref_frame_map
                                      [(cpi->common).remapped_ref_idx[uVar23 - 1]]->buf,0x120,
                                     (cpi->common).features.byte_alignment,cpi->alloc_pyramid,
                                     num_planes), iVar11 != 0)))) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate frame buffer");
            }
            pRVar19 = cpi->scaled_ref_buf[lVar22 + -1];
            pRVar20 = pRVar19;
            if (pRVar19 == (RefCntBuffer *)0x0) {
              __mutex = (pthread_mutex_t *)(cpi->common).buffer_pool;
              piVar8 = *(int **)((long)__mutex + 0x40);
              pthread_mutex_lock(__mutex);
              bVar2 = ((cpi->common).buffer_pool)->num_frame_bufs;
              if (bVar2 == 0) {
                uVar15 = 0;
              }
              else {
                uVar14 = 0;
                piVar21 = piVar8;
                do {
                  uVar15 = uVar14;
                  if (*piVar21 == 0) break;
                  uVar14 = uVar14 + 1;
                  piVar21 = piVar21 + 0x1638;
                  uVar15 = (ulong)bVar2;
                } while (bVar2 != uVar14);
              }
              uVar23 = 0xffffffff;
              if ((uint)uVar15 != (uint)bVar2) {
                piVar21 = piVar8 + (uVar15 & 0xffffffff) * 0x1638;
                if (piVar8[(uVar15 & 0xffffffff) * 0x1638 + 0x148] != 0) {
                  *(undefined8 *)(piVar21 + 0x142) = *(undefined8 *)(piVar21 + 0x14a);
                  *(undefined8 *)(piVar21 + 0x144) = *(undefined8 *)(piVar21 + 0x14c);
                  *(undefined8 *)(piVar21 + 0x146) = *(undefined8 *)(piVar21 + 0x14e);
                  piVar21[0x148] = 0;
                }
                *piVar21 = 1;
                uVar23 = (uint)uVar15;
              }
              pthread_mutex_unlock((pthread_mutex_t *)(cpi->common).buffer_pool);
              if (uVar23 == 0xffffffff) {
                aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                   "Unable to find free frame buffer");
              }
              pRVar20 = pBVar6->frame_bufs + (int)uVar23;
            }
            if (((pRVar19 == (RefCntBuffer *)0x0) ||
                ((pRVar20->buf).field_2.field_0.y_crop_width != (cpi->common).width)) ||
               ((pRVar20->buf).field_3.field_0.y_crop_height != (cpi->common).height)) {
              ybf = &pRVar20->buf;
              pSVar9 = (cpi->common).seq_params;
              iVar11 = aom_realloc_frame_buffer
                                 (ybf,(cpi->common).width,(cpi->common).height,pSVar9->subsampling_x
                                  ,pSVar9->subsampling_y,(uint)pSVar9->use_highbitdepth,0x120,
                                  (cpi->common).features.byte_alignment,
                                  (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,
                                  (void *)0x0,false,0);
              if (iVar11 != 0) {
                if (pRVar19 == (RefCntBuffer *)0x0) {
                  pRVar20->ref_count = pRVar20->ref_count + -1;
                }
                aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate frame buffer");
              }
              iVar11 = (pRVar13->buf).field_2.field_0.y_crop_width;
              iVar3 = (pRVar13->buf).field_3.field_0.y_crop_height;
              iVar4 = (pRVar20->buf).field_2.field_0.y_crop_width;
              iVar5 = (pRVar20->buf).field_3.field_0.y_crop_height;
              if (((((iVar4 * 4 < iVar11) || (iVar5 * 4 < iVar3)) ||
                   ((iVar11 * 0x10 < iVar4 ||
                    ((iVar3 * 0x10 < iVar5 || ((iVar4 << 4) % iVar11 != 0)))))) ||
                  ((iVar11 * 0x10) % iVar4 != 0)) ||
                 (((iVar5 << 4) % iVar3 != 0 || ((iVar3 * 0x10) % iVar5 != 0)))) {
                if (iVar4 * 4 + iVar11 * -3 == 0) {
                  bVar24 = iVar5 * 4 == iVar3 * 3;
                }
                else {
                  bVar24 = false;
                }
              }
              else {
                bVar24 = true;
              }
              bVar25 = (bool)(uVar1 != '\0' & bVar24);
              if ((uVar1 == '\0') && (bVar24)) {
                iVar11 = (pRVar13->buf).field_2.field_0.uv_crop_width;
                iVar3 = (pRVar13->buf).field_3.field_0.uv_crop_height;
                iVar4 = (pRVar20->buf).field_2.field_0.uv_crop_width;
                iVar5 = (pRVar20->buf).field_3.field_0.uv_crop_height;
                if (((iVar4 * 4 < iVar11) ||
                    ((((iVar5 * 4 < iVar3 || (iVar11 * 0x10 < iVar4)) || (iVar3 * 0x10 < iVar5)) ||
                     (((iVar4 << 4) % iVar11 != 0 || ((iVar11 * 0x10) % iVar4 != 0)))))) ||
                   (((iVar5 << 4) % iVar3 != 0 || ((iVar3 * 0x10) % iVar5 != 0)))) {
                  if (iVar4 * 4 + iVar11 * -3 == 0) {
                    bVar25 = iVar5 * 4 == iVar3 * 3;
                  }
                  else {
                    bVar25 = false;
                  }
                }
                else {
                  bVar25 = true;
                }
              }
              if (((use_optimized_scaler == 0) || (!bVar25)) ||
                 (((cpi->common).seq_params)->bit_depth != AOM_BITS_8)) {
                _Var10 = av1_resize_and_extend_frame_nonnormative
                                   (&pRVar13->buf,ybf,((cpi->common).seq_params)->bit_depth,
                                    num_planes);
                if (!_Var10) {
                  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                     "Failed to allocate buffer during resize");
                }
              }
              else {
                (*av1_resize_and_extend_frame)(&pRVar13->buf,ybf,filter,phase,num_planes);
              }
              cpi->scaled_ref_buf[lVar22 + -1] = pRVar20;
              if (((pRVar20->mvs == (MV_REF *)0x0) ||
                  (pRVar20->mi_rows != (cpi->common).mi_params.mi_rows)) ||
                 (pRVar20->mi_cols != (cpi->common).mi_params.mi_cols)) {
                aom_free(pRVar20->mvs);
                iVar11 = (cpi->common).mi_params.mi_rows;
                pRVar20->mi_rows = iVar11;
                iVar3 = (cpi->common).mi_params.mi_cols;
                pRVar20->mi_cols = iVar3;
                pMVar16 = (MV_REF *)aom_calloc((long)((iVar3 + 1 >> 1) * (iVar11 + 1 >> 1)),8);
                pRVar20->mvs = pMVar16;
                if (pMVar16 == (MV_REF *)0x0) {
                  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                     "Failed to allocate buf->mvs");
                }
                aom_free(pRVar20->seg_map);
                puVar17 = (uint8_t *)
                          aom_calloc((long)(cpi->common).mi_params.mi_cols *
                                     (long)(cpi->common).mi_params.mi_rows,1);
                pRVar20->seg_map = puVar17;
                if (puVar17 == (uint8_t *)0x0) {
                  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                     "Failed to allocate buf->seg_map");
                }
              }
              iVar11 = ((cpi->common).mi_params.mi_stride >> 1) *
                       ((cpi->common).mi_params.mi_rows + 0x20 >> 1);
              pTVar18 = (cpi->common).tpl_mvs;
              if ((pTVar18 == (TPL_MV_REF *)0x0) || ((cpi->common).tpl_mvs_mem_size < iVar11)) {
                aom_free(pTVar18);
                pTVar18 = (TPL_MV_REF *)aom_calloc((long)iVar11,8);
                (cpi->common).tpl_mvs = pTVar18;
                if (pTVar18 == (TPL_MV_REF *)0x0) {
                  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                     "Failed to allocate cm->tpl_mvs");
                }
                (cpi->common).tpl_mvs_mem_size = iVar11;
              }
              iVar11 = (cpi->common).height;
              pRVar20->width = (cpi->common).width;
              pRVar20->height = iVar11;
            }
          }
        }
      }
    }
LAB_001bacf3:
    lVar22 = lVar22 + 1;
    if (lVar22 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void av1_scale_references(AV1_COMP *cpi, const InterpFilter filter,
                          const int phase, const int use_optimized_scaler) {
  AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      BufferPool *const pool = cm->buffer_pool;
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // For RTC-SVC: if force_zero_mode_spatial_ref is enabled, check if the
      // motion search can be skipped for the references: last, golden, altref.
      // If so, we can skip scaling that reference.
      if (cpi->ppi->use_svc && cpi->svc.force_zero_mode_spatial_ref &&
          cpi->ppi->rtc_ref.set_ref_frame_config) {
        if (ref_frame == LAST_FRAME && cpi->svc.skip_mvsearch_last) continue;
        if (ref_frame == GOLDEN_FRAME && cpi->svc.skip_mvsearch_gf) continue;
        if (ref_frame == ALTREF_FRAME && cpi->svc.skip_mvsearch_altref)
          continue;
      }
      // For RTC with superres on: golden reference only needs to be scaled
      // if it was refreshed in previous frame.
      if (is_one_pass_rt_params(cpi) &&
          cpi->oxcf.superres_cfg.enable_superres && ref_frame == GOLDEN_FRAME &&
          cpi->rc.frame_num_last_gf_refresh <
              (int)cm->current_frame.frame_number - 1) {
        continue;
      }

      if (ref->y_crop_width != cm->width || ref->y_crop_height != cm->height) {
        // Replace the reference buffer with a copy having a thicker border,
        // if the reference buffer is higher resolution than the current
        // frame, and the border is thin.
        if ((ref->y_crop_width > cm->width ||
             ref->y_crop_height > cm->height) &&
            ref->border < AOM_BORDER_IN_PIXELS) {
          RefCntBuffer *ref_fb = get_ref_frame_buf(cm, ref_frame);
          if (aom_yv12_realloc_with_new_border(
                  &ref_fb->buf, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, cpi->alloc_pyramid,
                  num_planes) != 0) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
        }
        int force_scaling = 0;
        RefCntBuffer *new_fb = cpi->scaled_ref_buf[ref_frame - 1];
        if (new_fb == NULL) {
          const int new_fb_idx = get_free_fb(cm);
          if (new_fb_idx == INVALID_IDX) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Unable to find free frame buffer");
          }
          force_scaling = 1;
          new_fb = &pool->frame_bufs[new_fb_idx];
        }

        if (force_scaling || new_fb->buf.y_crop_width != cm->width ||
            new_fb->buf.y_crop_height != cm->height) {
          if (aom_realloc_frame_buffer(
                  &new_fb->buf, cm->width, cm->height,
                  cm->seq_params->subsampling_x, cm->seq_params->subsampling_y,
                  cm->seq_params->use_highbitdepth, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, NULL, NULL, NULL, false, 0)) {
            if (force_scaling) {
              // Release the reference acquired in the get_free_fb() call above.
              --new_fb->ref_count;
            }
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          bool has_optimized_scaler = av1_has_optimized_scaler(
              ref->y_crop_width, ref->y_crop_height, new_fb->buf.y_crop_width,
              new_fb->buf.y_crop_height);
          if (num_planes > 1) {
            has_optimized_scaler =
                has_optimized_scaler &&
                av1_has_optimized_scaler(
                    ref->uv_crop_width, ref->uv_crop_height,
                    new_fb->buf.uv_crop_width, new_fb->buf.uv_crop_height);
          }
#if CONFIG_AV1_HIGHBITDEPTH
          if (use_optimized_scaler && has_optimized_scaler &&
              cm->seq_params->bit_depth == AOM_BITS_8) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#else
          if (use_optimized_scaler && has_optimized_scaler) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#endif
          cpi->scaled_ref_buf[ref_frame - 1] = new_fb;
          alloc_frame_mvs(cm, new_fb);
        }
      } else {
        RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
        buf->buf.y_crop_width = ref->y_crop_width;
        buf->buf.y_crop_height = ref->y_crop_height;
        cpi->scaled_ref_buf[ref_frame - 1] = buf;
        ++buf->ref_count;
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}